

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_DeadReckoningParameter.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::LE_DeadReckoningParameter::Encode
          (LE_DeadReckoningParameter *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  LE_DeadReckoningParameter *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8DeadRecknoningAlgorithm);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_LinearAcceleration).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar1,&(this->m_AngularVelocity).super_DataTypeBase);
  return;
}

Assistant:

void LE_DeadReckoningParameter::Encode( KDataStream & stream ) const
{
    stream << m_ui8DeadRecknoningAlgorithm
           << KDIS_STREAM m_LinearAcceleration
           << KDIS_STREAM m_AngularVelocity;
}